

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgga_x_scanl.c
# Opt level: O2

void mgga_x_scanl_init(xc_func_type *p)

{
  int iVar1;
  int mgga_id;
  
  iVar1 = p->info->number;
  mgga_id = 0x107;
  if (iVar1 != 700) {
    if (iVar1 != 0x2bd) {
      fwrite("Internal error in mgga_x_scanl_init\n",0x24,1,_stderr);
      exit(1);
    }
    mgga_id = 0x245;
  }
  xc_deorbitalize_init(p,mgga_id,0x27a);
  return;
}

Assistant:

static void
mgga_x_scanl_init(xc_func_type *p)
{
  switch(p->info->number){
  case(XC_MGGA_X_SCANL):
    xc_deorbitalize_init(p, XC_MGGA_X_SCAN, XC_MGGA_K_PC07_OPT);
    break;
  case(XC_MGGA_X_REVSCANL):
    xc_deorbitalize_init(p, XC_MGGA_X_REVSCAN, XC_MGGA_K_PC07_OPT);
    break;
  default:
    fprintf(stderr,"Internal error in mgga_x_scanl_init\n");
    exit(1);
  }
}